

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::FillCMakeSystemVariablePath(cmFindBase *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  mapped_type *this_00;
  string *psVar5;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  entry_to_remove staging_entry;
  entry_to_remove install_entry;
  string var;
  cmAlphaNum local_f8;
  cmAlphaNum local_c8;
  undefined1 local_98 [16];
  size_type local_88;
  undefined1 local_70 [16];
  size_type local_60;
  string local_48;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeSystem);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_FIND_NO_INSTALL_PREFIX",(allocator<char> *)&local_c8);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  bVar4 = (this->super_cmFindCommon).NoCMakeInstallPath;
  if (bVar4 == false) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_FIND_USE_INSTALL_PREFIX",(allocator<char> *)&local_c8);
    bVar3 = cmMakefile::IsDefinitionSet(pcVar1,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    bVar3 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"INSTALL",(allocator<char> *)&local_c8);
  anon_unknown.dwarf_15cac53::entry_to_remove::entry_to_remove
            ((entry_to_remove *)local_70,(string *)&local_f8,(this->super_cmFindCommon).Makefile);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"STAGING",(allocator<char> *)&local_c8);
  anon_unknown.dwarf_15cac53::entry_to_remove::entry_to_remove
            ((entry_to_remove *)local_98,(string *)&local_f8,(this->super_cmFindCommon).Makefile);
  std::__cxx11::string::~string((string *)&local_f8);
  if ((bVar4 != true || bVar2) ||
     ((((long)local_70._0_8_ < 1 || (local_60 == 0)) &&
      (((long)local_98._0_8_ < 1 || (local_88 == 0)))))) {
    if ((bVar2 & bVar3) == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&local_c8);
      cmSearchPath::AddCMakePrefixPath(this_00,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_STAGING_PREFIX",(allocator<char> *)&local_c8);
      cmSearchPath::AddCMakePrefixPath(this_00,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&local_c8);
      cmSearchPath::AddCMakePrefixPath(this_00,(string *)&local_f8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&local_c8);
      cmSearchPath::AddCMakePrefixPath(this_00,(string *)&local_f8);
    }
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&local_c8);
    psVar5 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    if (psVar5 == (string *)0x0) {
      psVar5 = &cmValue::Empty_abi_cxx11_;
    }
    arg._M_str = (psVar5->_M_dataplus)._M_p;
    arg._M_len = psVar5->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8,arg,false);
    anon_unknown.dwarf_15cac53::entry_to_remove::remove_self
              ((entry_to_remove *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8);
    anon_unknown.dwarf_15cac53::entry_to_remove::remove_self
              ((entry_to_remove *)local_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8);
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmFindCommon).Makefile);
    cmSearchPath::AddPrefixPaths
              (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_f8,(psVar5->_M_dataplus)._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
  }
  local_f8.View_._M_len = 0xd;
  local_f8.View_._M_str = "CMAKE_SYSTEM_";
  local_c8.View_._M_str = (this->super_cmFindCommon).CMakePathName._M_dataplus._M_p;
  local_c8.View_._M_len = (this->super_cmFindCommon).CMakePathName._M_string_length;
  cmStrCat<char[6]>(&local_48,&local_f8,&local_c8,(char (*) [6])0x5c07cc);
  cmSearchPath::AddCMakePath(this_00,&local_48);
  bVar4 = std::operator==(&(this->super_cmFindCommon).CMakePathName,"PROGRAM");
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_SYSTEM_APPBUNDLE_PATH",(allocator<char> *)&local_c8);
    cmSearchPath::AddCMakePath(this_00,(string *)&local_f8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_SYSTEM_FRAMEWORK_PATH",(allocator<char> *)&local_c8);
    cmSearchPath::AddCMakePath(this_00,(string *)&local_f8);
  }
  std::__cxx11::string::~string((string *)&local_f8);
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string((string *)(local_70 + 8));
  return;
}

Assistant:

void cmFindBase::FillCMakeSystemVariablePath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  const bool install_prefix_in_list =
    !this->Makefile->IsOn("CMAKE_FIND_NO_INSTALL_PREFIX");
  const bool remove_install_prefix = this->NoCMakeInstallPath;
  const bool add_install_prefix = !this->NoCMakeInstallPath &&
    this->Makefile->IsDefinitionSet("CMAKE_FIND_USE_INSTALL_PREFIX");

  // We have 3 possible states for `CMAKE_SYSTEM_PREFIX_PATH` and
  // `CMAKE_INSTALL_PREFIX`.
  // Either we need to remove `CMAKE_INSTALL_PREFIX`, add
  // `CMAKE_INSTALL_PREFIX`, or do nothing.
  //
  // When we need to remove `CMAKE_INSTALL_PREFIX` we remove the Nth occurrence
  // of `CMAKE_INSTALL_PREFIX` from `CMAKE_SYSTEM_PREFIX_PATH`, where `N` is
  // computed by `CMakeSystemSpecificInformation.cmake` while constructing
  // `CMAKE_SYSTEM_PREFIX_PATH`. This ensures that if projects / toolchains
  // have removed `CMAKE_INSTALL_PREFIX` from the list, we don't remove
  // some other entry by mistake ( likewise for `CMAKE_STAGING_PREFIX` )
  entry_to_remove install_entry("INSTALL", this->Makefile);
  entry_to_remove staging_entry("STAGING", this->Makefile);

  if (remove_install_prefix && install_prefix_in_list &&
      (install_entry.valid() || staging_entry.valid())) {
    cmValue prefix_paths =
      this->Makefile->GetDefinition("CMAKE_SYSTEM_PREFIX_PATH");

    // remove entries from CMAKE_SYSTEM_PREFIX_PATH
    std::vector<std::string> expanded = cmExpandedList(*prefix_paths);
    install_entry.remove_self(expanded);
    staging_entry.remove_self(expanded);

    paths.AddPrefixPaths(expanded,
                         this->Makefile->GetCurrentSourceDirectory().c_str());
  } else if (add_install_prefix && !install_prefix_in_list) {
    paths.AddCMakePrefixPath("CMAKE_INSTALL_PREFIX");
    paths.AddCMakePrefixPath("CMAKE_STAGING_PREFIX");
    paths.AddCMakePrefixPath("CMAKE_SYSTEM_PREFIX_PATH");
  } else {
    // Otherwise the current setup of `CMAKE_SYSTEM_PREFIX_PATH` is correct
    paths.AddCMakePrefixPath("CMAKE_SYSTEM_PREFIX_PATH");
  }

  std::string var = cmStrCat("CMAKE_SYSTEM_", this->CMakePathName, "_PATH");
  paths.AddCMakePath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");
  } else {
    paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}